

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O0

void on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int status_local;
  uv_stream_t *server_local;
  
  if ((long)status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x59,"status","==","0",(long)status,"==",0);
    abort();
  }
  iVar1 = uv_tcp_init(server->loop,&connection);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x5b,"uv_tcp_init(server->loop, &connection)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_accept(server,&connection);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x5d,"uv_accept(server, (uv_stream_t* )&connection)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_read_start(&connection,on_alloc,on_read1);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop-start.c"
            ,0x5f,"uv_read_start((uv_stream_t*)&connection, on_alloc, on_read1)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void on_connection(uv_stream_t* server, int status) {
  uv_tcp_t* handle;
  int r;

  ASSERT_OK(status);

  handle = malloc(sizeof(*handle));
  ASSERT_NOT_NULL(handle);

  r = uv_tcp_init_ex(server->loop, handle, AF_INET);
  ASSERT_OK(r);

  r = uv_accept(server, (uv_stream_t*)handle);
  ASSERT_EQ(r, UV_EBUSY);

  uv_close((uv_handle_t*) server, NULL);
  uv_close((uv_handle_t*) handle, (uv_close_cb)free);
}